

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O0

int run_test_tcp_connect_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_1c [4];
  int r;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("8.8.8.8",9999,local_1c);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
            ,0x43,"0 == uv_ip4_addr(\"8.8.8.8\", 9999, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
            ,0x46,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&timer,timer_cb,0x32,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
            ,0x49,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&conn);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
            ,0x4c,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,&conn,local_1c,connect_cb);
  if (iVar1 == -0x65) {
    fprintf(_stderr,"%s\n","Network unreachable.");
    fflush(_stderr);
    addr.sin_zero[0] = '\x01';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  else {
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x54,"r == 0");
      abort();
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x57,"r == 0");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-connect-timeout.c"
              ,0x59,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}